

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePiram>_>::SetFreeIntPtIndices
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePiram>_> *this)

{
  TPZManVector<long,_128> *this_00;
  int64_t iVar1;
  ulong *puVar2;
  long in_RDI;
  int64_t i;
  int64_t n;
  TPZMatWithMemBase *matWithMem;
  TPZMaterial *material;
  long *local_40;
  TPZCompEl *in_stack_ffffffffffffffd0;
  int64_t local_28;
  long *plVar3;
  
  this_00 = (TPZManVector<long,_128> *)TPZCompEl::Material(in_stack_ffffffffffffffd0);
  if (this_00 == (TPZManVector<long,_128> *)0x0) {
    local_40 = (long *)0x0;
  }
  else {
    local_40 = (long *)__dynamic_cast(this_00,&TPZMaterial::typeinfo,&TPZMatWithMemBase::typeinfo,
                                      0xfffffffffffffffe);
  }
  if (local_40 != (long *)0x0) {
    iVar1 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x108));
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      plVar3 = local_40;
      puVar2 = (ulong *)TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x108),local_28);
      (**(code **)(*local_40 + 0x60))(local_40,*puVar2 & 0xffffffff);
      local_40 = plVar3;
    }
  }
  TPZManVector<long,_128>::Resize(this_00,(int64_t)local_40);
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::SetFreeIntPtIndices() {
    
    TPZMaterial * material = TBASE::Material();
    auto * matWithMem =
        dynamic_cast<TPZMatWithMemBase *>(material);
    if (matWithMem) {
        int64_t n = fIntPtIndices.NElements();
        
        for (int64_t i = 0; i < n; i++) {
            matWithMem->FreeMemItem(fIntPtIndices[i]);
        }
    }
    fIntPtIndices.Resize(0);
}